

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O3

void my_do_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  long *plVar3;
  Am_Value value;
  Am_Value local_18;
  
  local_18.type = 0;
  local_18.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  Am_Value::operator=(&local_18,pAVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n+-+-+- Command ",0x10)
  ;
  poVar2 = (ostream *)operator<<((ostream *)&std::cout,cmd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," value = ",9);
  plVar3 = (long *)operator<<(poVar2,&local_18);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::ostream::flush();
  Am_Value::~Am_Value(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, my_do, (Am_Object cmd))
{
  Am_Value value;
  value = cmd.Peek(Am_VALUE);
  std::cout << "\n+-+-+- Command " << cmd << " value = " << value << std::endl
            << std::flush;
}